

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall
CTPNInhClass::gen_code_member
          (CTPNInhClass *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,
          int varargs,CTcNamedArgs *named_args)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  CTcSymbol *pCVar5;
  _func_int **__n;
  void *__buf;
  void *__buf_00;
  CTcGenTarg *pCVar6;
  
  if ((G_cs->field_0xa8 & 1) == 0) {
    CTcTokenizer::log_error(0x2cef);
  }
  if ((~G_cg->field_0xd0 & 0x18) != 0) {
    pCVar5 = CTcPrsSymtab::find_or_def_undef
                       (G_cs->symtab_,(this->super_CTPNInhClassBase).sym_,
                        (this->super_CTPNInhClassBase).len_,0);
    __n = (pCVar5->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry;
    uVar3 = (*__n[0x17])(pCVar5);
    if (uVar3 != 0) {
      uVar4 = (*(prop_expr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x19])
                        (prop_expr,0,(ulong)(uint)prop_is_expr);
      if ((short)uVar4 == 0) {
        if (varargs != 0) {
          CTcGenTarg::write_op(G_cg,0x8d);
          CTcGenTarg::write_op(G_cg,'v');
        }
        CTcGenTarg::write_op(G_cg,'u');
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)argc,__buf_00,(size_t)__n);
        pCVar6 = (CTcGenTarg *)G_cs;
        CTcDataStream::write_obj_id(&G_cs->super_CTcDataStream,(ulong)uVar3);
        G_cg->sp_depth_ = G_cg->sp_depth_ + ~argc;
      }
      else {
        if (varargs != 0) {
          CTcGenTarg::write_op(G_cg,'v');
        }
        CTcGenTarg::write_op(G_cg,'t');
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)argc,__buf,(size_t)__n);
        CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,uVar4 & 0xffff);
        pCVar6 = (CTcGenTarg *)G_cs;
        CTcDataStream::write_obj_id(&G_cs->super_CTcDataStream,(ulong)uVar3);
        G_cg->sp_depth_ = G_cg->sp_depth_ - argc;
      }
      CTcGenTarg::post_call_cleanup(pCVar6,named_args);
      if (discard == 0) {
        CTcGenTarg::write_op(G_cg,0x8b);
        pCVar6 = G_cg;
        iVar2 = G_cg->sp_depth_;
        iVar1 = iVar2 + 1;
        G_cg->sp_depth_ = iVar1;
        if (pCVar6->max_sp_depth_ <= iVar2) {
          pCVar6->max_sp_depth_ = iVar1;
        }
      }
      return;
    }
    CTcTokenizer::log_error
              (0x2cfe,(ulong)(uint)(this->super_CTPNInhClassBase).len_,
               (this->super_CTPNInhClassBase).sym_);
    return;
  }
  err_throw(0x9c5);
}

Assistant:

void CTPNInhClass::gen_code_member(int discard,
                                   CTcPrsNode *prop_expr, int prop_is_expr,
                                   int argc, int varargs,
                                   CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;
    CTcSymbol *objsym;
    vm_obj_id_t obj;

    /* 
     *   make sure "self" is available - we obviously can't inherit
     *   anything if we're not in an object's method 
     */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_SELF_NOT_AVAIL);

    /* don't allow 'inherited' in speculative evaluation mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* get the superclass name symbol */
    objsym = G_cs->get_symtab()->find_or_def_undef(sym_, len_, FALSE);
    
    /* if it's not an object, we can't inherit from it */
    obj = objsym->get_val_obj();
    if (obj == VM_INVALID_OBJ)
    {
        G_tok->log_error(TCERR_INH_NOT_OBJ, (int)len_, sym_);
        return;
    }

    /* generate the property value */
    prop = prop_expr->gen_code_propid(FALSE, prop_is_expr);

    /* 
     *   if we got a property ID, generate a simple EXPINHERIT; otherwise,
     *   generate a PTREXPINHERIT 
     */
    if (prop != VM_INVALID_PROP)
    {
        /* add a varargs modifier if needed */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);
        
        /* we have a constant property ID - generate a regular EXPINHERIT */
        G_cg->write_op(OPC_EXPINHERIT);
        G_cs->write((char)argc);
        G_cs->write_prop_id(prop);
        G_cs->write_obj_id(obj);

        /* this removes argumnts */
        G_cg->note_pop(argc);
    }
    else
    {
        /* 
         *   if we have a varargs list, modify the call instruction that
         *   follows to make it a varargs call 
         */
        if (varargs)
        {
            /* swap the top of the stack to get the arg counter back on top */
            G_cg->write_op(OPC_SWAP);
            
            /* write the varargs modifier */
            G_cg->write_op(OPC_VARARGC);
        }
        
        /* a property pointer is on the stack - write a PTREXPINHERIT */
        G_cg->write_op(OPC_PTREXPINHERIT);
        G_cs->write((int)argc);
        G_cs->write_obj_id(obj);

        /* this removes arguments and the property pointer */
        G_cg->note_pop(argc + 1);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if the result is needed, push it */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}